

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vsubecuq_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = a->u64[1];
  uVar2 = b->u64[1];
  uVar3 = 1;
  if ((uVar1 <= uVar2 && (ulong)(b->u64[0] < a->u64[0]) <= uVar2 - uVar1) &&
     (uVar3 = 0, (c->u8[0] & 1) != 0)) {
    uVar3 = (ulong)(uVar2 == uVar1 && b->u64[0] == a->u64[0]);
  }
  r->u64[0] = uVar3;
  r->u64[1] = 0;
  return;
}

Assistant:

void helper_vsubecuq(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, ppc_avr_t *c)
{
#ifdef CONFIG_INT128
    r->u128 =
        (~a->u128 < ~b->u128) ||
        ((c->u128 & 1) && (a->u128 + ~b->u128 == (__uint128_t)-1));
#else
    int carry_in = c->VsrD(1) & 1;
    int carry_out = (avr_qw_cmpu(*a, *b) > 0);
    if (!carry_out && carry_in) {
        ppc_avr_t tmp;
        avr_qw_not(&tmp, *b);
        avr_qw_add(&tmp, *a, tmp);
#ifdef _MSC_VER
        carry_out = ((tmp.VsrD(0) == (0ULL - 1ULL)) && (tmp.VsrD(1) == (0ULL - 1ULL)));
#else
        carry_out = ((tmp.VsrD(0) == -1ull) && (tmp.VsrD(1) == -1ull));
#endif
    }

    r->VsrD(0) = 0;
    r->VsrD(1) = carry_out;
#endif
}